

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

archive * archive_match_new(void)

{
  archive *paVar1;
  archive *paVar2;
  
  paVar1 = (archive *)calloc(1,0x208);
  paVar2 = (archive *)0x0;
  if (paVar1 != (archive *)0x0) {
    paVar1->magic = 0xcad11c9;
    paVar1->state = 1;
    paVar1[1].file_count = 0;
    paVar1[1].archive_error_number = 0;
    paVar1[1].error = (char *)&paVar1[1].file_count;
    *(undefined4 *)&paVar1[1].error_string.s = 0;
    paVar1[1].vtable = (archive_vtable_conflict *)0x0;
    *(archive_vtable_conflict ***)&paVar1[1].archive_format = &paVar1[1].vtable;
    *(undefined4 *)&paVar1[1].archive_format_name = 0;
    __archive_rb_tree_init((archive_rb_tree *)&paVar1[2].compression_code,&rb_ops_mbs);
    paVar1[2].file_count = 0;
    paVar1[2].archive_error_number = 0;
    paVar1[2].error = (char *)&paVar1[2].file_count;
    *(undefined4 *)&paVar1[2].error_string.s = 0;
    paVar1[2].read_data_offset = 0;
    paVar1[2].read_data_output_offset = (int64_t)&paVar1[2].read_data_offset;
    *(undefined4 *)&paVar1[2].read_data_remaining = 0;
    paVar1[3].magic = 0;
    paVar1[3].state = 0;
    paVar1[3].vtable = (archive_vtable_conflict *)(paVar1 + 3);
    paVar1[3].archive_format = 0;
    time((time_t *)&paVar1[1].current_code);
    paVar2 = paVar1;
  }
  return paVar2;
}

Assistant:

struct archive *
archive_match_new(void)
{
	struct archive_match *a;

	a = (struct archive_match *)calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_MATCH_MAGIC;
	a->archive.state = ARCHIVE_STATE_NEW;
	match_list_init(&(a->inclusions));
	match_list_init(&(a->exclusions));
	__archive_rb_tree_init(&(a->exclusion_tree), &rb_ops_mbs);
	entry_list_init(&(a->exclusion_entry_list));
	match_list_init(&(a->inclusion_unames));
	match_list_init(&(a->inclusion_gnames));
	time(&a->now);
	return (&(a->archive));
}